

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     add<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination,read_t<unsigned_short> source,Context *context)

{
  ushort uVar1;
  uint uVar2;
  ushort value;
  undefined6 in_register_00000032;
  
  uVar1 = *destination;
  uVar2 = (uint)CONCAT62(in_register_00000032,source);
  value = ((short)(uVar1 + uVar2) + 1) - (ushort)((context->flags).carry_ == 0);
  (context->flags).carry_ = ((~(uint)value | uVar1 & uVar2) & (uVar1 | uVar2)) >> 0xf;
  (context->flags).auxiliary_carry_ = ((uint)value ^ uVar2 ^ uVar1) >> 4 & 1;
  (context->flags).overflow_ = (uint)(uVar1 ^ value) & ~(uVar2 ^ uVar1) & 0x8000;
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,value);
  *destination = value;
  return;
}

Assistant:

void add(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST + SRC [+ CF];
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination + source + (with_carry ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<true, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<true, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	destination = result;
}